

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall asmjit::BaseBuilder::_newLabelNode(BaseBuilder *this,LabelNode **out)

{
  uint uVar1;
  Error EVar2;
  Error EVar3;
  Error extraout_EAX;
  LabelEntry *pLVar4;
  uint n;
  undefined4 extraout_EDX;
  BaseBuilder *allocator;
  CodeHolder *this_00;
  ZoneVector<asmjit::LabelNode_*> *unaff_R15;
  size_t sStack_78;
  CodeHolder *pCStack_70;
  BaseBuilder *pBStack_68;
  ZoneVector<asmjit::LabelNode_*> *pZStack_60;
  code *pcStack_58;
  _func_int **pp_Stack_48;
  Error local_c;
  
  *out = (LabelNode *)0x0;
  if ((this->_allocator)._zone != (Zone *)0x0) {
    _newLabelNode();
    return local_c;
  }
  _newLabelNode();
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    return 5;
  }
  allocator = (BaseBuilder *)&stack0xffffffffffffffb8;
  pcStack_58 = (code *)0x112b33;
  EVar2 = CodeHolder::newLabelEntry(this_00,(LabelEntry **)allocator);
  if (EVar2 != 0) {
    return EVar2;
  }
  uVar1 = *(uint *)((long)pp_Stack_48 + 0xc);
  n = uVar1 + 1;
  if ((this->_labelNodes).super_ZoneVectorBase._size < n) {
    unaff_R15 = &this->_labelNodes;
    allocator = (BaseBuilder *)&this->_allocator;
    pcStack_58 = (code *)0x112b6b;
    this_00 = (CodeHolder *)unaff_R15;
    EVar3 = ZoneVectorBase::_resize(&unaff_R15->super_ZoneVectorBase,(ZoneAllocator *)allocator,8,n)
    ;
    if (EVar3 != 0) {
      return EVar3;
    }
    if (uVar1 < (this->_labelNodes).super_ZoneVectorBase._size) {
      *(LabelNode ***)((long)(unaff_R15->super_ZoneVectorBase)._data + (ulong)uVar1 * 8) = out;
      *(uint *)&(((CodeHolder *)out)->_zone)._block = uVar1;
      return 0;
    }
  }
  else {
    pcStack_58 = (code *)0x112ba3;
    registerLabelNode();
  }
  pcStack_58 = _newAlignNode;
  registerLabelNode();
  (allocator->super_BaseEmitter)._vptr_BaseEmitter = (_func_int **)0x0;
  pCStack_70 = (CodeHolder *)out;
  pBStack_68 = this;
  pZStack_60 = unaff_R15;
  pcStack_58 = (code *)(ulong)EVar2;
  if ((this_00->_sections).super_ZoneVectorBase._data == (void *)0x0) {
    _newAlignNode();
    EVar2 = extraout_EAX;
  }
  else {
    pLVar4 = (LabelEntry *)
             ZoneAllocator::_alloc((ZoneAllocator *)&this_00->_sections,0x38,&sStack_78);
    EVar3 = 0;
    out = (LabelNode **)this_00;
    this = allocator;
    EVar2 = 0;
    if (pLVar4 != (LabelEntry *)0x0) {
      *(undefined8 *)pLVar4 = 0;
      *(undefined8 *)&pLVar4->field_0x8 = 0;
      pLVar4->_type = '\x04';
      pLVar4->_flags = *(byte *)&this_00[1]._zone._end | 0x11;
      *(undefined8 *)&pLVar4->_reserved16 = 0;
      *(undefined8 *)((long)&pLVar4->_offset + 2) = 0;
      pLVar4->_section = (Section *)0x0;
      pLVar4->_links = (LabelLink *)0x0;
      *(undefined4 *)&(pLVar4->_name).field_0 = extraout_EDX;
      *(uint *)((long)&(pLVar4->_name).field_0 + 4) = n;
      goto LAB_00112c0e;
    }
  }
  EVar3 = EVar2;
  pLVar4 = (LabelEntry *)0x0;
LAB_00112c0e:
  (this->super_BaseEmitter)._vptr_BaseEmitter = (_func_int **)pLVar4;
  if (pLVar4 == (LabelEntry *)0x0) {
    EVar3 = BaseEmitter::reportError((BaseEmitter *)out,1,(char *)0x0);
  }
  return EVar3;
}

Assistant:

Error BaseBuilder::_newLabelNode(LabelNode** out) {
  *out = nullptr;

  ASMJIT_PROPAGATE(_newNodeT<LabelNode>(out));
  return registerLabelNode(*out);
}